

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O0

vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_> * __thiscall
TextBuffer::Layer::find_words_with_subsequence_in_range
          (vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>
           *__return_storage_ptr__,Layer *this,u16string *query,u16string *extra_word_characters,
          Range range)

{
  allocator<TextBuffer::Layer::SubsequenceMatchVariant> *this_00;
  value_type vVar1;
  ulong uVar2;
  size_t sVar3;
  initializer_list<TextBuffer::Layer::SubsequenceMatchVariant> __l;
  __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
  _Var4;
  Point PVar5;
  bool bVar6;
  bool bVar7;
  wint_t wVar8;
  int iVar9;
  size_type sVar10;
  iterator __first;
  iterator __last;
  iterator __result;
  Point PVar11;
  mapped_type *this_01;
  reference ppVar12;
  const_reference pvVar13;
  reference pvVar14;
  reference pvVar15;
  pointer pSVar16;
  reference pSVar17;
  iterator iVar18;
  iterator iVar19;
  short sVar20;
  SubsequenceMatchVariant *local_430;
  value_type local_3b0;
  reference local_358;
  SubsequenceMatchVariant *match_variant_1;
  iterator __end2;
  iterator __begin2;
  vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
  *__range2;
  SubsequenceMatchVariant *best_match;
  const_iterator local_328;
  __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
  local_320;
  SubsequenceMatchVariant *local_318;
  __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
  local_310;
  __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
  local_308;
  __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
  existing_match_iter;
  SubsequenceMatchVariant *new_variant;
  iterator __end3;
  iterator __begin3;
  vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
  *__range3;
  SubsequenceMatchVariant *local_2d8;
  __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
  local_2d0;
  __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
  local_2c8;
  __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
  next_match_variant;
  undefined1 local_2b8 [8];
  SubsequenceMatchVariant new_match;
  __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
  local_288;
  iterator match_variant;
  undefined4 uStack_278;
  uint16_t c;
  size_t i;
  vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
  new_match_variants;
  SubsequenceMatchVariant local_250;
  undefined1 local_228 [24];
  vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
  match_variants;
  vector<Point,_std::allocator<Point>_> *start_positions;
  u16string *word;
  pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
  entry;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>_>
  *__range1;
  anon_class_56_7_63254529 local_198;
  ClipResult local_160;
  Point local_150;
  ClipResult local_148;
  Point local_138;
  ClipResult local_130;
  Point local_120;
  ClipResult local_118;
  Point local_108;
  undefined1 local_100 [8];
  unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>_>
  substring_matches;
  undefined1 local_98 [8];
  u16string raw_query;
  u16string current_word;
  Point current_word_start;
  Point position;
  size_t query_index;
  size_t MAX_WORD_LENGTH;
  u16string *extra_word_characters_local;
  u16string *query_local;
  Layer *this_local;
  Range range_local;
  vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_> *matches;
  
  position.row = 0;
  position.column = 0;
  Point::Point(&current_word_start);
  Point::Point((Point *)((long)&current_word.field_2 + 8));
  std::__cxx11::u16string::u16string((u16string *)((long)&raw_query.field_2 + 8));
  std::__cxx11::u16string::u16string((u16string *)local_98,query);
  sVar10 = std::__cxx11::
           basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::size
                     (query);
  if (sVar10 < 0x51) {
    __first = std::__cxx11::
              basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::begin
                        (query);
    __last = std::__cxx11::
             basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::end
                       (query);
    __result = std::__cxx11::
               basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::begin
                         (query);
    substring_matches._M_h._M_single_bucket =
         (__node_base_ptr)
         std::
         transform<__gnu_cxx::__normal_iterator<char16_t*,std::__cxx11::u16string>,__gnu_cxx::__normal_iterator<char16_t*,std::__cxx11::u16string>,unsigned_int(*)(unsigned_int)noexcept>
                   ((__normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                     )__first._M_current,
                    (__normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                     )__last._M_current,
                    (__normal_iterator<char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                     )__result._M_current,towlower);
    std::
    unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>_>
    ::unordered_map((unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>_>
                     *)local_100);
    local_120 = range.start;
    local_130 = clip_position(this,range.start,false);
    local_108 = local_130.position;
    local_150 = range.end;
    local_118 = local_130;
    local_160 = clip_position(this,range.end,false);
    local_138 = local_160.position;
    local_198.current_word = (u16string *)((long)&raw_query.field_2 + 8);
    local_198.current_word_start = (Point *)((long)&current_word.field_2 + 8);
    local_198.position = &current_word_start;
    local_198.query_index = (size_t *)&position;
    local_198.substring_matches =
         (unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>_>
          *)local_100;
    local_198.extra_word_characters = extra_word_characters;
    local_198.query = query;
    local_148 = local_160;
    for_each_chunk_in_range<TextBuffer::Layer::find_words_with_subsequence_in_range(std::__cxx11::u16string,std::__cxx11::u16string_const&,Range)::_lambda(TextSlice)_1_>
              (this,local_108,local_138,&local_198,false);
    bVar6 = std::__cxx11::
            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::empty
                      ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                        *)((long)&raw_query.field_2 + 8));
    PVar5 = position;
    if (!bVar6) {
      PVar11 = (Point)std::__cxx11::
                      basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                      ::size(query);
      if (PVar5 == PVar11) {
        sVar10 = std::__cxx11::
                 basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::size
                           ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                             *)((long)&raw_query.field_2 + 8));
        if (sVar10 < 0x51) {
          this_01 = std::
                    unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>_>
                    ::operator[]((unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>_>
                                  *)local_100,(key_type *)((long)&raw_query.field_2 + 8));
          std::vector<Point,_std::allocator<Point>_>::push_back
                    (this_01,(value_type *)((long)&current_word.field_2 + 8));
        }
      }
    }
    std::vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>::vector
              (__return_storage_ptr__);
    __end1 = std::
             unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>_>
             ::begin((unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>_>
                      *)local_100);
    entry.second.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)std::
                  unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>_>
                  ::end((unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>_>
                         *)local_100);
    while( true ) {
      bVar6 = std::__detail::operator!=
                        (&__end1.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_true>
                         ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_true>
                           *)&entry.second.super__Vector_base<Point,_std::allocator<Point>_>._M_impl
                              .super__Vector_impl_data._M_end_of_storage);
      if (!bVar6) break;
      ppVar12 = std::__detail::
                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_false,_true>
                ::operator*(&__end1);
      std::
      pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
      ::pair((pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
              *)&word,ppVar12);
      match_variants.
      super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)&entry.first.field_2 + 8)
      ;
      local_250.query_index = 0;
      local_250.match_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_250.match_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_250.match_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_250.match_indices);
      local_250.score = 0;
      local_228._0_8_ = &local_250;
      local_228._8_8_ = (pointer)0x1;
      this_00 = (allocator<TextBuffer::Layer::SubsequenceMatchVariant> *)
                ((long)&new_match_variants.
                        super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>::allocator(this_00);
      __l._M_len = local_228._8_8_;
      __l._M_array = (iterator)local_228._0_8_;
      std::
      vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
      ::vector((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                *)(local_228 + 0x10),__l,this_00);
      std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>::~allocator
                ((allocator<TextBuffer::Layer::SubsequenceMatchVariant> *)
                 ((long)&new_match_variants.
                         super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      local_430 = (SubsequenceMatchVariant *)local_228;
      do {
        local_430 = local_430 + -1;
        SubsequenceMatchVariant::~SubsequenceMatchVariant(local_430);
      } while (local_430 != &local_250);
      std::
      vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
      ::vector((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                *)&i);
      _uStack_278 = 0;
      while( true ) {
        sVar10 = std::__cxx11::
                 basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::size
                           ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                             *)&word);
        if (sVar10 <= _uStack_278) break;
        pvVar13 = std::__cxx11::
                  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
                  operator[]((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                              *)&word,_uStack_278);
        wVar8 = towlower((uint)(ushort)*pvVar13);
        match_variant._M_current._6_2_ = (value_type)wVar8;
        local_288._M_current =
             (SubsequenceMatchVariant *)
             std::
             vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
             ::begin((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                      *)(local_228 + 0x10));
        while( true ) {
          new_match._32_8_ =
               std::
               vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
               ::end((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                      *)(local_228 + 0x10));
          bVar6 = __gnu_cxx::operator!=
                            (&local_288,
                             (__normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                              *)&new_match.score);
          if (!bVar6) break;
          pSVar16 = __gnu_cxx::
                    __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                    ::operator->(&local_288);
          uVar2 = pSVar16->query_index;
          sVar10 = std::__cxx11::
                   basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
                   size(query);
          vVar1 = match_variant._M_current._6_2_;
          if (uVar2 < sVar10) {
            pSVar16 = __gnu_cxx::
                      __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                      ::operator->(&local_288);
            pvVar14 = std::__cxx11::
                      basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                      ::operator[](query,pSVar16->query_index);
            if (vVar1 == *pvVar14) {
              pSVar17 = __gnu_cxx::
                        __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                        ::operator*(&local_288);
              SubsequenceMatchVariant::SubsequenceMatchVariant
                        ((SubsequenceMatchVariant *)local_2b8,pSVar17);
              local_2b8 = (undefined1  [8])((long)local_2b8 + 1);
              if (_uStack_278 == 0) {
LAB_001c269e:
                pvVar13 = std::__cxx11::
                          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                          ::operator[]((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                                        *)&word,_uStack_278);
                vVar1 = *pvVar13;
                pSVar16 = __gnu_cxx::
                          __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                          ::operator->(&local_288);
                pvVar14 = std::__cxx11::
                          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                          ::operator[]((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                                        *)local_98,pSVar16->query_index);
                sVar20 = 9;
                if (vVar1 == *pvVar14) {
                  sVar20 = 10;
                }
                new_match.match_indices.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._0_2_ =
                     (short)new_match.match_indices.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage + sVar20;
              }
              else {
                pvVar13 = std::__cxx11::
                          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                          ::operator[]((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                                        *)&word,_uStack_278 - 1);
                iVar9 = iswalnum((uint)(ushort)*pvVar13);
                if (iVar9 == 0) goto LAB_001c269e;
                pvVar13 = std::__cxx11::
                          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                          ::operator[]((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                                        *)&word,_uStack_278 - 1);
                iVar9 = iswlower((uint)(ushort)*pvVar13);
                if (iVar9 != 0) {
                  pvVar13 = std::__cxx11::
                            basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                            ::operator[]((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                                          *)&word,_uStack_278);
                  iVar9 = iswupper((uint)(ushort)*pvVar13);
                  if (iVar9 != 0) goto LAB_001c269e;
                }
              }
              bVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_match);
              if (!bVar6) {
                pvVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     &new_match);
                if ((ulong)*pvVar15 == _uStack_278 - 1) {
                  new_match.match_indices.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._0_2_ =
                       (short)new_match.match_indices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 5;
                }
              }
              next_match_variant._M_current._4_4_ = uStack_278;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&new_match,
                         (value_type_conflict2 *)((long)&next_match_variant._M_current + 4));
              std::
              vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
              ::push_back((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                           *)&i,(value_type *)local_2b8);
              SubsequenceMatchVariant::~SubsequenceMatchVariant
                        ((SubsequenceMatchVariant *)local_2b8);
            }
            if (_uStack_278 < 3) {
              pSVar16 = __gnu_cxx::
                        __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                        ::operator->(&local_288);
              pSVar16->score = pSVar16->score + -3;
            }
            else {
              pSVar16 = __gnu_cxx::
                        __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                        ::operator->(&local_288);
              pSVar16->score = pSVar16->score + -1;
            }
            local_2c8 = __gnu_cxx::
                        __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                        ::operator+(&local_288,1);
            local_2d0._M_current =
                 (SubsequenceMatchVariant *)
                 std::
                 vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                 ::end((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                        *)(local_228 + 0x10));
            bVar7 = __gnu_cxx::operator!=(&local_2c8,&local_2d0);
            bVar6 = false;
            if (bVar7) {
              pSVar16 = __gnu_cxx::
                        __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                        ::operator->(&local_2c8);
              sVar3 = pSVar16->query_index;
              pSVar16 = __gnu_cxx::
                        __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                        ::operator->(&local_288);
              bVar6 = sVar3 == pSVar16->query_index;
            }
            if (bVar6) {
              __gnu_cxx::
              __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_const*,std::vector<TextBuffer::Layer::SubsequenceMatchVariant,std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>>>
              ::__normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant*>
                        ((__normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_const*,std::vector<TextBuffer::Layer::SubsequenceMatchVariant,std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>>>
                          *)&__range3,&local_288);
              local_2d8 = (SubsequenceMatchVariant *)
                          std::
                          vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                          ::erase((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                                   *)(local_228 + 0x10),(const_iterator)__range3);
              local_288._M_current = local_2d8;
            }
            else {
              __gnu_cxx::
              __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
              ::operator++(&local_288);
            }
          }
          else {
            __gnu_cxx::
            __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
            ::operator++(&local_288);
          }
        }
        __end3 = std::
                 vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                 ::begin((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                          *)&i);
        new_variant = (SubsequenceMatchVariant *)
                      std::
                      vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                      ::end((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                             *)&i);
        while( true ) {
          bVar6 = __gnu_cxx::operator!=
                            (&__end3,(__normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                                      *)&new_variant);
          if (!bVar6) break;
          existing_match_iter._M_current =
               __gnu_cxx::
               __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
               ::operator*(&__end3);
          local_310._M_current =
               (SubsequenceMatchVariant *)
               std::
               vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
               ::begin((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                        *)(local_228 + 0x10));
          local_318 = (SubsequenceMatchVariant *)
                      std::
                      vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                      ::end((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                             *)(local_228 + 0x10));
          local_308 = std::
                      lower_bound<__gnu_cxx::__normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant*,std::vector<TextBuffer::Layer::SubsequenceMatchVariant,std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>>>,TextBuffer::Layer::SubsequenceMatchVariant>
                                (local_310,
                                 (__normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                                  )local_318,existing_match_iter._M_current);
          local_320._M_current =
               (SubsequenceMatchVariant *)
               std::
               vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
               ::end((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                      *)(local_228 + 0x10));
          bVar7 = __gnu_cxx::operator!=(&local_308,&local_320);
          bVar6 = false;
          if (bVar7) {
            sVar3 = (existing_match_iter._M_current)->query_index;
            pSVar16 = __gnu_cxx::
                      __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                      ::operator->(&local_308);
            bVar6 = sVar3 == pSVar16->query_index;
          }
          if (bVar6) {
            sVar20 = (existing_match_iter._M_current)->score;
            pSVar16 = __gnu_cxx::
                      __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                      ::operator->(&local_308);
            _Var4 = existing_match_iter;
            if (sVar20 < pSVar16->score) goto LAB_001c2b18;
            pSVar17 = __gnu_cxx::
                      __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                      ::operator*(&local_308);
            SubsequenceMatchVariant::operator=(pSVar17,_Var4._M_current);
          }
          else {
LAB_001c2b18:
            __gnu_cxx::
            __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_const*,std::vector<TextBuffer::Layer::SubsequenceMatchVariant,std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>>>
            ::__normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant*>
                      ((__normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_const*,std::vector<TextBuffer::Layer::SubsequenceMatchVariant,std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>>>
                        *)&local_328,&local_308);
            std::
            vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
            ::insert((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                      *)(local_228 + 0x10),local_328,existing_match_iter._M_current);
          }
          __gnu_cxx::
          __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
          ::operator++(&__end3);
        }
        std::
        vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
        ::clear((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                 *)&i);
        _uStack_278 = _uStack_278 + 1;
      }
      __range2 = (vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                  *)0x0;
      __end2 = std::
               vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
               ::begin((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                        *)(local_228 + 0x10));
      match_variant_1 =
           (SubsequenceMatchVariant *)
           std::
           vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
           ::end((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                  *)(local_228 + 0x10));
      while( true ) {
        bVar6 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                                    *)&match_variant_1);
        if (!bVar6) break;
        local_358 = __gnu_cxx::
                    __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
                    ::operator*(&__end2);
        sVar3 = local_358->query_index;
        sVar10 = std::__cxx11::
                 basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::size
                           (query);
        if ((sVar3 == sVar10) &&
           ((__range2 ==
             (vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
              *)0x0 ||
            (*(short *)&__range2[1].
                        super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                        ._M_impl.super__Vector_impl_data._M_finish < local_358->score)))) {
          __range2 = (vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                      *)local_358;
        }
        __gnu_cxx::
        __normal_iterator<TextBuffer::Layer::SubsequenceMatchVariant_*,_std::vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>_>
        ::operator++(&__end2);
      }
      std::__cxx11::u16string::u16string
                ((u16string *)&local_3b0,
                 (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
                 &word);
      std::vector<Point,_std::allocator<Point>_>::vector
                (&local_3b0.positions,
                 (vector<Point,_std::allocator<Point>_> *)
                 match_variants.
                 super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&local_3b0.match_indices,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &(__range2->
                  super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                  )._M_impl.super__Vector_impl_data._M_finish);
      local_3b0.score =
           (int32_t)*(short *)&__range2[1].
                               super__Vector_base<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
      std::vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>::
      push_back(__return_storage_ptr__,&local_3b0);
      SubsequenceMatch::~SubsequenceMatch(&local_3b0);
      std::
      vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
      ::~vector((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                 *)&i);
      std::
      vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
      ::~vector((vector<TextBuffer::Layer::SubsequenceMatchVariant,_std::allocator<TextBuffer::Layer::SubsequenceMatchVariant>_>
                 *)(local_228 + 0x10));
      std::
      pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>
               *)&word);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>,_false,_true>
      ::operator++(&__end1);
    }
    iVar18 = std::
             vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>::
             begin(__return_storage_ptr__);
    iVar19 = std::
             vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>::
             end(__return_storage_ptr__);
    std::
    sort<__gnu_cxx::__normal_iterator<TextBuffer::SubsequenceMatch*,std::vector<TextBuffer::SubsequenceMatch,std::allocator<TextBuffer::SubsequenceMatch>>>,TextBuffer::Layer::find_words_with_subsequence_in_range(std::__cxx11::u16string,std::__cxx11::u16string_const&,Range)::_lambda(TextBuffer::SubsequenceMatch_const&,TextBuffer::SubsequenceMatch_const&)_1_>
              (iVar18._M_current,iVar19._M_current);
    std::
    unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>_>
    ::~unordered_map((unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_std::vector<Point,_std::allocator<Point>_>_>_>_>
                      *)local_100);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::vector<TextBuffer::SubsequenceMatch,_std::allocator<TextBuffer::SubsequenceMatch>_>::vector
              (__return_storage_ptr__);
  }
  std::__cxx11::u16string::~u16string((u16string *)local_98);
  std::__cxx11::u16string::~u16string((u16string *)((long)&raw_query.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

vector<SubsequenceMatch> find_words_with_subsequence_in_range(u16string query, const u16string &extra_word_characters, Range range) {
    const size_t MAX_WORD_LENGTH = 80;
    size_t query_index = 0;
    Point position;
    Point current_word_start;
    u16string current_word;
    u16string raw_query = query;

    if (query.size() > MAX_WORD_LENGTH) return vector<SubsequenceMatch>{};

    std::transform(query.begin(), query.end(), query.begin(), std::towlower);

    // First, find the start position of all words matching the given
    // subsequence.
    std::unordered_map<u16string, vector<Point>> substring_matches;

    for_each_chunk_in_range(
      clip_position(range.start).position,
      clip_position(range.end).position,
      [&] (TextSlice chunk) -> bool {
        for (uint16_t c : chunk) {
          bool is_word_character =
            std::iswalnum(c) ||
            std::find(extra_word_characters.begin(), extra_word_characters.end(), c) != extra_word_characters.end();

          if (is_word_character) {
            if (current_word.empty()) current_word_start = position;
            current_word += c;
            if (query_index < query.size() && towlower(c) == query[query_index]) {
              query_index++;
            }
          } else {
            if (!current_word.empty()) {
              if (query_index == query.size() && current_word.size() <= MAX_WORD_LENGTH) {
                substring_matches[current_word].push_back(current_word_start);
              }
              query_index = 0;
              current_word.clear();
            }
          }

          if (c == '\n') {
            position.row++;
            position.column = 0;
          } else {
            position.column++;
          }
        }

        return false;
      });

    if (!current_word.empty() && query_index == query.size() && current_word.size() <= MAX_WORD_LENGTH) {
      substring_matches[current_word].push_back(current_word_start);
    }

    // Next, calculate a score for each word indicating the quality of the
    // match against the query.

    static const unsigned consecutive_bonus = 5;
    static const unsigned subword_start_with_case_match_bonus = 10;
    static const unsigned subword_start_with_case_mismatch_bonus = 9;
    static const unsigned mismatch_penalty = 1;
    static const unsigned leading_mismatch_penalty = 3;

    vector<SubsequenceMatch> matches;

    for (auto entry : substring_matches) {
      const u16string &word = entry.first;
      const vector<Point> &start_positions = entry.second;

      vector<SubsequenceMatchVariant> match_variants {{}};
      vector<SubsequenceMatchVariant> new_match_variants;

      for (size_t i = 0; i < word.size(); i++) {
        uint16_t c = towlower(word[i]);

        for (auto match_variant = match_variants.begin(); match_variant != match_variants.end();) {
          if (match_variant->query_index < query.size()) {
            // If the current word character matches the next character of
            // the query for this match variant, create a *new* match variant
            // that consumes the matching character.
            if (c == query[match_variant->query_index]) {
              SubsequenceMatchVariant new_match = *match_variant;
              new_match.query_index++;

              if (i == 0 ||
                  !std::iswalnum(word[i - 1]) ||
                  (std::iswlower(word[i - 1]) && std::iswupper(word[i]))) {
                new_match.score += word[i] == raw_query[match_variant->query_index]
                  ? subword_start_with_case_match_bonus
                  : subword_start_with_case_mismatch_bonus;
              }

              if (!new_match.match_indices.empty() && new_match.match_indices.back() == i - 1) {
                new_match.score += consecutive_bonus;
              }

              new_match.match_indices.push_back(i);
              new_match_variants.push_back(new_match);
            }

            // For the current match variant, treat the current character as
            // a mismatch regardless of whether it matched above. This
            // reserves the chance for the next character to be consumed by a
            // match with higher overall value.
            if (i < 3) {
              match_variant->score -= leading_mismatch_penalty;
            } else {
              match_variant->score -= mismatch_penalty;
            }

            // If a match variant does *not* match the current character (and is therefore
            // ineligible for the consecutive match bonus on the next character), its
            // potential for future scoring is determined entirely by its `query_index`.
            //
            // These match variants are ordered by ascending `query_index`. If multiple
            // match variants have the same `query_index`, they are ordered by ascending
            // `score`.
            //
            // If there is another match variant with the same `query_index` and a greater
            // or equal `score`, discard the current match variant.
            auto next_match_variant = match_variant + 1;
            if (next_match_variant != match_variants.end() && next_match_variant->query_index == match_variant->query_index) {
              match_variant = match_variants.erase(match_variant);
            } else {
              ++match_variant;
            }
          } else {
            ++match_variant;
          }
        }

        // Add all of the newly-computed match variants to the list. Avoid creating duplicate
        // match variants with the same query index unless the new variant (which is
        // by definition eligible for the consecutive match bonus on the next character) has
        // a lower score than an existing variant. Maintain the invariant that match variants
        // are ordered by ascending `query_index` and ascending `score`.
        for (const SubsequenceMatchVariant &new_variant : new_match_variants) {
          auto existing_match_iter = std::lower_bound(match_variants.begin(), match_variants.end(), new_variant);
          if (existing_match_iter != match_variants.end() && new_variant.query_index == existing_match_iter->query_index) {
            if (new_variant.score >= existing_match_iter->score) {
              *existing_match_iter = new_variant;
              continue;
            }
          }
          match_variants.insert(existing_match_iter, new_variant);
        }
        new_match_variants.clear();
      }

      SubsequenceMatchVariant *best_match = nullptr;
      for (auto &match_variant : match_variants) {
        if (match_variant.query_index == query.size()) {
          if (!best_match || best_match->score < match_variant.score) {
            best_match = &match_variant;
          }
        }
      }

      matches.push_back(SubsequenceMatch{word, start_positions, best_match->match_indices, best_match->score});
    }

    std::sort(matches.begin(), matches.end(), [] (const SubsequenceMatch &a, const SubsequenceMatch &b) {
      // Doing it this way helps us avoid sorting ambiguity keeping the ordering the same across platforms.
      if (a.score > b.score) return true;
      if (b.score > a.score) return false;
      return a.word < b.word;
    });

    return matches;
  }